

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O1

void counter_inc(counter *c,int increment)

{
  int *piVar1;
  
  if (increment != 0) {
    nsync_mu_lock(&c->mu);
    piVar1 = &c->value;
    *piVar1 = *piVar1 + increment;
    if (*piVar1 == 0) {
      nsync_cv_broadcast(&c->cv);
    }
    nsync_mu_unlock(&c->mu);
    return;
  }
  return;
}

Assistant:

static void counter_inc (counter *c, int increment) {
	if (increment != 0) {
		nsync_mu_lock (&c->mu);
		c->value += increment;
		if (c->value == 0) {
			nsync_cv_broadcast (&c->cv);
		}
		nsync_mu_unlock (&c->mu);
	}
}